

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O2

int __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::weightTo
          (WeightedDigraphSPAcyclic<int,_int> *this,int vertex)

{
  bool bVar1;
  int iVar2;
  out_of_range *this_00;
  int vertex_local;
  
  bVar1 = hasPathTo(this,vertex);
  if (bVar1) {
    iVar2 = data_structures::SymbolTable<int,_int>::get(&this->_weight_to,&vertex_local);
    return iVar2;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"No path!");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

Weight weightTo(T vertex) {
            if (!hasPathTo(vertex)) {
                throw std::out_of_range("No path!");
            }
            return _weight_to.get(vertex);
        }